

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O3

qcc_uint qcc_stream_get(qcc_stream *self)

{
  qcc_list_node *node;
  qcc_uint qVar1;
  
  if (self->is_writing == 0) {
    if (self->node == (qcc_stream_node *)0x0) {
      self->is_overrun = 1;
    }
    else if (self->is_overrun == 0) goto LAB_00103afb;
    qVar1 = 0;
  }
  else {
    _generate_data(self);
LAB_00103afb:
    node = (qcc_list_node *)qcc_arena_alloc(self->arena,0x18);
    node[1].next = (qcc_list_node *)self->node;
    qcc_list_push_front((qcc_list *)&self->interval_stack,node);
    qVar1 = self->node->value;
    self->node = self->node->next;
    qcc_stream_end(self);
  }
  return qVar1;
}

Assistant:

qcc_uint qcc_stream_get(struct qcc_stream *self)
{
    if (self->is_writing)
        _generate_data(self);
    else
    {
        if (!self->node) self->is_overrun = 1;
        if (self->is_overrun) return 0;
    }

    qcc_stream_begin(self);
    qcc_uint result = self->node->value;
    self->node = self->node->next;
    qcc_stream_end(self);
    return result;
}